

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveObjectsWriter.cpp
# Opt level: O0

void __thiscall
PrimitiveObjectsWriter::WriteInteger
          (PrimitiveObjectsWriter *this,longlong inIntegerToken,ETokenSeparator inSeparate)

{
  IByteWriter *pIVar1;
  size_t sVar2;
  char local_228 [8];
  char buffer [512];
  ETokenSeparator inSeparate_local;
  longlong inIntegerToken_local;
  PrimitiveObjectsWriter *this_local;
  
  if (this->mStreamForWriting != (IByteWriter *)0x0) {
    sprintf(local_228,"%lld",inIntegerToken);
    pIVar1 = this->mStreamForWriting;
    sVar2 = strlen(local_228);
    (*pIVar1->_vptr_IByteWriter[2])(pIVar1,local_228,sVar2);
    WriteTokenSeparator(this,inSeparate);
  }
  return;
}

Assistant:

void PrimitiveObjectsWriter::WriteInteger(long long inIntegerToken,ETokenSeparator inSeparate)
{
	if(!mStreamForWriting)
		return;
	char buffer[512];

	SAFE_SPRINTF_1(buffer,512,"%lld",inIntegerToken);
	mStreamForWriting->Write((const IOBasicTypes::Byte *)buffer,strlen(buffer));
	WriteTokenSeparator(inSeparate);
}